

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall crnlib::mipmapped_texture::change_dxt1_to_dxt1a(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  mip_level *pmVar2;
  pixel_format pVar3;
  component_flags cVar4;
  uint l;
  ulong uVar5;
  uint f;
  ulong uVar6;
  
  if (this->m_format == PIXEL_FMT_DXT1) {
    this->m_format = PIXEL_FMT_DXT1A;
    cVar4 = pixel_format_helpers::get_component_flags(PIXEL_FMT_DXT1A);
    this->m_comp_flags = cVar4;
    for (uVar6 = 0; uVar6 < (this->m_faces).m_size; uVar6 = uVar6 + 1) {
      for (uVar5 = 0; pvVar1 = (this->m_faces).m_p, uVar5 < pvVar1[uVar6].m_size; uVar5 = uVar5 + 1)
      {
        pmVar2 = pvVar1[uVar6].m_p[uVar5];
        if (pmVar2->m_pDXTImage != (dxt_image *)0x0) {
          pVar3 = this->m_format;
          pmVar2->m_comp_flags = this->m_comp_flags;
          pmVar2->m_format = pVar3;
          dxt_image::change_dxt1_to_dxt1a(pmVar2->m_pDXTImage);
        }
      }
    }
  }
  return;
}

Assistant:

void mipmapped_texture::change_dxt1_to_dxt1a() {
  if (m_format != PIXEL_FMT_DXT1)
    return;

  m_format = PIXEL_FMT_DXT1A;

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  for (uint f = 0; f < m_faces.size(); f++) {
    for (uint l = 0; l < m_faces[f].size(); l++) {
      if (m_faces[f][l]->get_dxt_image()) {
        m_faces[f][l]->set_format(m_format);
        m_faces[f][l]->set_comp_flags(m_comp_flags);

        m_faces[f][l]->get_dxt_image()->change_dxt1_to_dxt1a();
      }
    }
  }
}